

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadVariantSelectionMap(CrateReader *this,VariantSelectionMap *d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  char cVar6;
  char cVar7;
  ulong uVar8;
  uint64_t sz;
  string value;
  string __str;
  ostringstream ss_e;
  ulong local_1f8;
  string local_1f0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_1d0;
  long *local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (d != (VariantSelectionMap *)0x0) {
    local_1d0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 *)d;
    bVar3 = StreamReader::read8(this->_sr,&local_1f8);
    if (bVar3) {
      if ((this->_config).maxVariantsMapElements < local_1f8) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadVariantSelectionMap",0x17);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x6be);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "The number of elements for VariantsMap data is too large. Max = ",0x40);
        uVar8 = (this->_config).maxVariantsMapElements;
        cVar6 = '\x01';
        cVar7 = '\x01';
        if (9 < uVar8) {
          uVar5 = uVar8;
          cVar2 = '\x04';
          do {
            cVar7 = cVar2;
            if (uVar5 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_001c369e;
            }
            if (uVar5 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_001c369e;
            }
            if (uVar5 < 10000) goto LAB_001c369e;
            bVar3 = 99999 < uVar5;
            uVar5 = uVar5 / 10000;
            cVar2 = cVar7 + '\x04';
          } while (bVar3);
          cVar7 = cVar7 + '\x01';
        }
LAB_001c369e:
        paVar1 = &local_1f0.field_2;
        local_1f0._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct((ulong)&local_1f0,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_1f0._M_dataplus._M_p,(uint)local_1f0._M_string_length,uVar8);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,
                            local_1f0._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,", but got ",10);
        if (9 < local_1f8) {
          uVar8 = local_1f8;
          cVar7 = '\x04';
          do {
            cVar6 = cVar7;
            if (uVar8 < 100) {
              cVar6 = cVar6 + -2;
              goto LAB_001c3748;
            }
            if (uVar8 < 1000) {
              cVar6 = cVar6 + -1;
              goto LAB_001c3748;
            }
            if (uVar8 < 10000) goto LAB_001c3748;
            bVar3 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar7 = cVar6 + '\x04';
          } while (bVar3);
          cVar6 = cVar6 + '\x01';
        }
LAB_001c3748:
        local_1c8 = local_1b8;
        ::std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar6);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1c8,local_1c0,local_1f8);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_1c8,CONCAT44(uStack_1bc,local_1c0));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      else {
        if (local_1f8 == 0) {
          return true;
        }
        paVar1 = &local_1f0.field_2;
        uVar8 = 0;
        while( true ) {
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          local_1a8[0]._M_string_length = 0;
          local_1a8[0].field_2._M_local_buf[0] = '\0';
          bVar3 = ReadString(this,local_1a8);
          if (!bVar3) break;
          local_1f0._M_string_length = 0;
          local_1f0.field_2._M_local_buf[0] = '\0';
          local_1f0._M_dataplus._M_p = (pointer)paVar1;
          bVar3 = ReadString(this,&local_1f0);
          if (!bVar3) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f0._M_dataplus._M_p,
                              CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                       local_1f0.field_2._M_local_buf[0]) + 1);
            }
            break;
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string&>
                    (local_1d0,local_1a8,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1f0._M_dataplus._M_p,
                            CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                     local_1f0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                     local_1a8[0].field_2._M_local_buf[0]) + 1);
          }
          uVar8 = uVar8 + 1;
          if (local_1f8 <= uVar8) {
            return true;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                   local_1a8[0].field_2._M_local_buf[0]) + 1);
        }
      }
    }
    else {
      ::std::__cxx11::string::append((char *)&this->_err);
    }
  }
  return false;
}

Assistant:

bool CrateReader::ReadVariantSelectionMap(VariantSelectionMap *d) {

  if (!d) {
    return false;
  }

  // map<string, string>

  // n
  // [key, value] * n

  uint64_t sz;
  if (!_sr->read8(&sz)) {
    _err += "Failed to read the number of elements for VariantsMap data.\n";
    return false;
  }

  if (sz > _config.maxVariantsMapElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "The number of elements for VariantsMap data is too large. Max = " << std::to_string(_config.maxVariantsMapElements) << ", but got " << std::to_string(sz));
  }

  for (size_t i = 0; i < sz; i++) {
    std::string key;
    if (!ReadString(&key)) {
      return false;
    }

    std::string value;
    if (!ReadString(&value)) {
      return false;
    }

    // TODO: Duplicate key check?
    d->emplace(key, value);
  }

  return true;
}